

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eeep_parse.c
# Opt level: O0

void ParseDisplayBlock(DisplayBlock_t *dblock)

{
  char *local_78;
  int local_6c;
  int i;
  char *suffixes [4];
  char *port_types [2];
  char *interfaces [4];
  DisplayBlock_t *dblock_local;
  
  port_types[1] = "DisplayPort";
  suffixes[3] = "DDI";
  port_types[0] = "eDP/DSI";
  suffixes[0] = ".a";
  suffixes[1] = ".b";
  suffixes[2] = ".c";
  printf("   COM-HPC Display Port block:\n");
  if ((uint)((int)(uint)dblock->PortNr >> 4) < 2) {
    local_78 = suffixes[(long)((int)(uint)dblock->PortNr >> 4) + 3];
  }
  else {
    local_78 = "?";
  }
  printf("      Port %d: %s; Supported interfaces: ",(ulong)(dblock->PortNr & 0xf),local_78);
  for (local_6c = 0; local_6c < 4; local_6c = local_6c + 1) {
    if (((uint)dblock->Interfaces & 1 << ((byte)local_6c & 0x1f)) != 0) {
      printf("%s ",port_types[(long)local_6c + 1]);
    }
  }
  printf("\n");
  printf("      DisplayPort version: %d.%d\n",(ulong)(dblock->DPVersion & 7),
         (ulong)((int)(uint)dblock->DPVersion >> 3 & 7));
  printf("      HDMI version: %d.%d%s\n",(ulong)(dblock->HDMIVersion & 7),
         (ulong)((int)(uint)dblock->HDMIVersion >> 3 & 7),
         suffixes[(long)((int)(uint)dblock->HDMIVersion >> 6) + -1]);
  printf("      Maximum size: %dx%d\n",(ulong)dblock->MaxWidth,(ulong)dblock->MaxHeight);
  return;
}

Assistant:

void ParseDisplayBlock(DisplayBlock_t *dblock)
{
    const char *interfaces[] =
        { "DisplayPort", "HDMI/DVI", "DSI", "eDP" };
    const char *port_types[] = { "DDI", "eDP/DSI" };
    const char *suffixes[] =
        { "", ".a", ".b", ".c" };
	printf("   COM-HPC Display Port block:\n");
	printf("      Port %d: %s; Supported interfaces: ", dblock->PortNr & 0xF, 
        (dblock->PortNr >> 4) < ARRAYSIZE(port_types) ? port_types[dblock->PortNr >> 4] : "?");
    for(int i = 0; i < 4; i++) {
        if(dblock->Interfaces & (1 << i)) {
            printf("%s ", interfaces[i]);
        }
    }
    printf("\n");
    printf("      DisplayPort version: %d.%d\n", 
        dblock->DPVersion & 7, (dblock->DPVersion >> 3) & 7);
    printf("      HDMI version: %d.%d%s\n", 
        dblock->HDMIVersion & 7, (dblock->HDMIVersion >> 3) & 7,
        suffixes[(dblock->HDMIVersion >> 6) & 3]);
    printf("      Maximum size: %dx%d\n", dblock->MaxWidth, dblock->MaxHeight);
}